

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O2

void * adt_ary_pop(adt_ary_t *self)

{
  int iVar1;
  void *pvVar2;
  
  if (self == (adt_ary_t *)0x0) {
    __assert_fail("(self!=0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_ary.c"
                  ,0xc9,"void *adt_ary_pop(adt_ary_t *)");
  }
  iVar1 = self->s32CurLen;
  if ((long)iVar1 != 0) {
    self->s32CurLen = iVar1 + -1;
    pvVar2 = self->pFirst[(long)iVar1 + -1];
    if (iVar1 + -1 != 0) {
      return pvVar2;
    }
    self->pFirst = self->ppAlloc;
    return pvVar2;
  }
  return (void *)0x0;
}

Assistant:

void*	adt_ary_pop(adt_ary_t *self){
	void *pElem;
	assert( (self!=0) );
	if(self->s32CurLen==0){
		return (void*) 0;
	}
	pElem = self->pFirst[--self->s32CurLen];
	if(self->s32CurLen == 0){
		//reallign pFirst with pAlloc when buffer becomes empty
		self->pFirst = self->ppAlloc;
	}
	return pElem;
}